

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

cio_http_cb_return save_websocket_key(cio_websocket_location_handler *wslh,char *at,size_t length)

{
  size_t length_local;
  char *at_local;
  cio_websocket_location_handler *wslh_local;
  
  if (length == 0x18) {
    memcpy(wslh->sec_websocket_key,at,0x18);
    memcpy(wslh->sec_websocket_key + 0x18,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
    wslh_local._4_4_ = CIO_HTTP_CB_SUCCESS;
  }
  else {
    wslh_local._4_4_ = CIO_HTTP_CB_ERROR;
  }
  return wslh_local._4_4_;
}

Assistant:

static enum cio_http_cb_return save_websocket_key(struct cio_websocket_location_handler *wslh, const char *at, size_t length)
{
	static const char WS_GUID[CIO_SEC_WEB_SOCKET_GUID_LENGTH] = {'2', '5', '8', 'E', 'A', 'F', 'A', '5', '-',
	                                                             'E', '9', '1', '4', '-', '4', '7', 'D', 'A', '-',
	                                                             '9', '5', 'C', 'A', '-',
	                                                             'C', '5', 'A', 'B', '0', 'D', 'C', '8', '5', 'B', '1', '1'};

	if (cio_likely(length == CIO_SEC_WEB_SOCKET_KEY_LENGTH)) {
		memcpy(wslh->sec_websocket_key, at, length);
		memcpy(&wslh->sec_websocket_key[length], WS_GUID, sizeof(WS_GUID));
		return CIO_HTTP_CB_SUCCESS;
	}

	return CIO_HTTP_CB_ERROR;
}